

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O1

void __thiscall
optimization::common_expr_del::Common_Expr_Del::init_funcs
          (Common_Expr_Del *this,MirPackage *package)

{
  _Rb_tree_header *p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Base_ptr p_Var2;
  bool bVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  _Base_ptr p_Var9;
  const_iterator cVar10;
  _Rb_tree_node_base *p_Var11;
  bool bVar12;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar13;
  
  p_Var9 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(package->functions)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    do {
      if (*(char *)&p_Var9[3]._M_parent[1]._M_left == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->mergeable_funcs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1)
                  );
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  p_Var9 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    this_00 = &this->mergeable_funcs;
    do {
      p_Var11 = *(_Rb_tree_node_base **)(p_Var9 + 6);
      if (p_Var11 != (_Rb_tree_node_base *)&p_Var9[5]._M_left) {
        bVar4 = false;
        bVar3 = false;
        do {
          p_Var2 = p_Var11[3]._M_left;
          p_Var5 = p_Var11[3]._M_parent;
          bVar6 = bVar4;
          do {
            bVar4 = bVar6;
            if (p_Var5 == p_Var2) break;
            iVar8 = (**(code **)(**(long **)p_Var5 + 8))();
            bVar12 = true;
            bVar7 = true;
            bVar4 = true;
            if (iVar8 != 3) {
              iVar8 = (**(code **)(**(long **)p_Var5 + 8))();
              bVar12 = true;
              bVar7 = true;
              bVar4 = true;
              if (iVar8 != 4) {
                iVar8 = (**(code **)(**(long **)p_Var5 + 8))();
                if (iVar8 == 6) {
                  cVar10 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find(&this_00->_M_t,(key_type *)(*(long *)p_Var5 + 0x18));
                  bVar12 = (_Rb_tree_header *)cVar10._M_node ==
                           &(this->mergeable_funcs)._M_t._M_impl.super__Rb_tree_header;
                  bVar7 = bVar6;
                  bVar4 = bVar6;
                  if (bVar12) {
                    bVar4 = true;
                    bVar7 = bVar4;
                  }
                }
                else {
                  bVar12 = false;
                  bVar7 = bVar3;
                  bVar4 = bVar6;
                }
              }
            }
            bVar3 = bVar7;
            p_Var5 = (_Base_ptr)&p_Var5->_M_parent;
            bVar6 = bVar4;
          } while (!bVar12);
        } while ((!bVar3) &&
                (p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11),
                p_Var11 != (_Rb_tree_node_base *)&p_Var9[5]._M_left));
        if (bVar3) {
          pVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::equal_range(&this_00->_M_t,(key_type *)(p_Var9 + 1));
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar13.first._M_node,
                         (_Base_ptr)pVar13.second._M_node);
        }
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  return;
}

Assistant:

void init_funcs(mir::inst::MirPackage& package) {
    for (auto& funcpair : package.functions) {
      if (funcpair.second.type->is_extern) continue;
      mergeable_funcs.insert(funcpair.first);
    }
    for (auto& funcpair : package.functions) {
      bool flag = false;
      for (auto& blkpair : funcpair.second.basic_blks) {
        for (auto& inst : blkpair.second.inst) {
          if (inst->inst_kind() == mir::inst::InstKind::Load ||
              inst->inst_kind() == mir::inst::InstKind::Store) {
            flag = true;
            break;
          }
          if (inst->inst_kind() == mir::inst::InstKind::Call) {
            auto& i = *inst;
            auto callInst = dynamic_cast<mir::inst::CallInst*>(&i);
            if (!mergeable_funcs.count(callInst->func)) {
              flag = true;
              break;
            }
          }
        }
        if (flag) {
          break;
        }
      }
      if (flag) {
        mergeable_funcs.erase(funcpair.first);
      }
    }
  }